

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void iterator_suite::test_iterator_constructible(void)

{
  size_type *psVar1;
  bool bVar2;
  iterator begin;
  iterator end;
  iterator iVar3;
  iterator local_88;
  undefined1 auStack_78 [8];
  iterator bravo;
  view_pointer local_58;
  view_pointer pcStack_50;
  undefined1 auStack_48 [8];
  iterator alpha;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0;
  psVar1 = &span.member.next;
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  psVar1 = &alpha.current;
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)psVar1,begin,end);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)psVar1,0xb);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)psVar1);
  local_58 = iVar3.parent;
  pcStack_50 = (view_pointer)iVar3.current;
  auStack_48 = (undefined1  [8])local_58;
  alpha.parent = pcStack_50;
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)psVar1);
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    ((basic_iterator<int> *)auStack_48,(iterator_type *)&bravo.current);
  boost::detail::test_impl
            ("alpha == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x282,"void iterator_suite::test_iterator_constructible()",bVar2);
  auStack_78 = auStack_48;
  bravo.parent = alpha.parent;
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)psVar1);
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    ((basic_iterator<int> *)auStack_78,&local_88);
  boost::detail::test_impl
            ("bravo == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x284,"void iterator_suite::test_iterator_constructible()",(bool)(-bVar2 & 1));
  return;
}

Assistant:

void test_iterator_constructible()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    decltype(span)::iterator alpha; // DefaultConstructible
    alpha = span.begin();
    BOOST_TEST(alpha == span.begin());
    decltype(span)::iterator bravo(alpha); // CopyConstructible
    BOOST_TEST(bravo == span.begin());
}